

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamreader.cpp
# Opt level: O2

StringResultCode
QCborStreamReaderPrivate::appendStringChunk(QCborStreamReader *reader,QByteArray *data)

{
  ReadStringChunk params;
  StringResult<long_long> SVar1;
  
  params.maxlen_or_type = -1;
  params.field_0.array = data;
  SVar1 = readStringChunk((reader->d)._M_t.
                          super___uniq_ptr_impl<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_QCborStreamReaderPrivate_*,_std::default_delete<QCborStreamReaderPrivate>_>
                          .super__Head_base<0UL,_QCborStreamReaderPrivate_*,_false>._M_head_impl,
                          params);
  if ((SVar1.status == EndOfString) &&
     ((((reader->d)._M_t.
        super___uniq_ptr_impl<QCborStreamReaderPrivate,_std::default_delete<QCborStreamReaderPrivate>_>
        ._M_t.
        super__Tuple_impl<0UL,_QCborStreamReaderPrivate_*,_std::default_delete<QCborStreamReaderPrivate>_>
        .super__Head_base<0UL,_QCborStreamReaderPrivate_*,_false>._M_head_impl)->lastError).c ==
      NoError)) {
    QCborStreamReader::preparse((QCborStreamReader *)reader);
  }
  return SVar1.status;
}

Assistant:

inline QCborStreamReader::StringResultCode
QCborStreamReaderPrivate::appendStringChunk(QCborStreamReader &reader, QByteArray *data)
{
    auto status = reader.d->readStringChunk(data).status;
    if (status == QCborStreamReader::EndOfString && reader.lastError() == QCborError::NoError)
        reader.preparse();
    return status;
}